

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::scanOutput(Parser *this,ScannedTopLevelItem *item)

{
  Identifier *this_00;
  bool bVar1;
  Module *pMVar2;
  OutputDeclaration *pOVar3;
  Identifier IVar4;
  string *name;
  Identifier *args;
  CodeLocation errorLocation;
  CodeLocation local_78;
  pool_ref<soul::heart::OutputDeclaration> local_68;
  CompileMessage local_60;
  
  local_78.sourceCode.object =
       (SourceCodeText *)
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::emplace_back<soul::UTF8Reader>
            (&item->outputDecls,(UTF8Reader *)&local_78);
  pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
  pOVar3 = Module::allocate<soul::heart::OutputDeclaration,soul::CodeLocation&>
                     (pMVar2,&(this->
                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                              ).location);
  IVar4 = parseGeneralIdentifier(this);
  this_00 = &(pOVar3->super_IODeclaration).name;
  (pOVar3->super_IODeclaration).name.name = IVar4.name;
  local_78.sourceCode.object =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if (local_78.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_78.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_78.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_78.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  name = Identifier::operator_cast_to_string_(this_00);
  bVar1 = isReservedFunctionName(name);
  if (!bVar1) {
    pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
    local_68.object = pOVar3;
    std::
    vector<soul::pool_ref<soul::heart::OutputDeclaration>,std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>>>
    ::emplace_back<soul::pool_ref<soul::heart::OutputDeclaration>>
              ((vector<soul::pool_ref<soul::heart::OutputDeclaration>,std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>>>
                *)&pMVar2->outputs,&local_68);
    skipPastNextOccurrenceOf(this,(TokenType)0x2a19e8);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_78.sourceCode);
    return;
  }
  Errors::invalidEndpointName<soul::Identifier&>(&local_60,(Errors *)this_00,args);
  CodeLocation::throwError(&local_78,&local_60);
}

Assistant:

void scanOutput (ScannedTopLevelItem& item)
    {
        item.outputDecls.push_back (getCurrentTokeniserPosition());
        auto& outputDeclaration = module->allocate<heart::OutputDeclaration> (location);
        outputDeclaration.name = parseGeneralIdentifier();

        auto errorLocation = location;
        if (isReservedFunctionName (outputDeclaration.name))
            errorLocation.throwError (Errors::invalidEndpointName (outputDeclaration.name));

        module->outputs.push_back (outputDeclaration);
        skipPastNextOccurrenceOf (HEARTOperator::semicolon);
    }